

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall
chrono::robosimian::RS_Chassis::RS_Chassis
          (RS_Chassis *this,string *name,bool fixed,shared_ptr<chrono::ChMaterialSurface> *mat,
          ChSystem *system)

{
  shared_ptr<chrono::ChBodyAuxRef> *__r;
  vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_> *this_00;
  vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  *this_01;
  undefined8 uVar1;
  ChFrame *pCVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  ChQuaternion<double> local_198;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_178 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_168;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  ChVector<double> local_118;
  ChFrame<double> local_f8;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_168,
             &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  RS_Part::RS_Part(&this->super_RS_Part,name,(shared_ptr<chrono::ChMaterialSurface> *)&local_168,
                   system);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
  (this->super_RS_Part)._vptr_RS_Part = (_func_int **)&PTR__RS_Part_0019f9d8;
  (this->super_RS_Part).field_0xec = 0;
  local_118.m_data[0] = 0.040288;
  local_118.m_data[1] = -0.001937;
  local_118.m_data[2] = -0.073574;
  local_138 = 0x3ff45aa92e62131b;
  uStack_130 = 0x40048cda6e75ff61;
  local_128 = 0x4008b224aada33be;
  local_158 = 0x3f8234eb9a176ddb;
  uStack_150 = 0xbfc1d883ba3443d4;
  local_148 = 0x3f354c985f06f694;
  *(undefined4 *)
   ((this->super_RS_Part).m_body.
    super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x28) = 0;
  chrono::ChVariablesBodyOwnMass::SetBodyMass(46.658335);
  __r = &(this->super_RS_Part).m_body;
  pCVar2 = (ChFrame *)
           (__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_198.m_data[0] = 1.0;
  local_198.m_data[3] = 0.0;
  local_198.m_data[1] = 0.0;
  local_198.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&local_f8,&local_118,&local_198);
  chrono::ChBodyAuxRef::SetFrame_COG_to_REF(pCVar2);
  chrono::ChBody::SetInertiaXX
            ((__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  chrono::ChBody::SetInertiaXY
            ((__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  chrono::ChBody::SetBodyFixed
            (SUB81((__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr,0));
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBodyAuxRef,void>
            (local_178,&__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(system,local_178);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170);
  this_00 = &(this->super_RS_Part).m_boxes;
  auVar3._8_8_ = _UpdateForces;
  auVar3._0_8_ = _UpdateForces;
  auVar3._16_8_ = _UpdateForces;
  auVar3._24_8_ = _UpdateForces;
  auVar3 = vblendps_avx(ZEXT1632(_VNULL),auVar3,0x30);
  auVar6._8_8_ = QUNIT;
  auVar6._0_8_ = QUNIT;
  auVar6._16_8_ = QUNIT;
  auVar6._24_8_ = QUNIT;
  local_f8._0_32_ = vblendps_avx(auVar3,auVar6,0xc0);
  local_f8.coord.rot.m_data[0] = _ChLinkMotorRotationSpeed;
  local_f8.coord.rot.m_data[1] = _ChBody;
  local_f8.coord.rot.m_data[2] = _ComputeMassProperties;
  local_f8.coord.rot.m_data[3] = 0.257;
  local_f8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.5;
  local_f8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.238;
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  emplace_back<chrono::robosimian::BoxShape>(this_00,(BoxShape *)&local_f8);
  auVar4._8_8_ = _UpdateForces;
  auVar4._0_8_ = _UpdateForces;
  auVar4._16_8_ = _UpdateForces;
  auVar4._24_8_ = _UpdateForces;
  auVar7._8_8_ = QUNIT;
  auVar7._0_8_ = QUNIT;
  auVar7._16_8_ = QUNIT;
  auVar7._24_8_ = QUNIT;
  auVar3 = vblendps_avx(ZEXT1632(_VNULL),auVar4,0x30);
  local_f8._0_32_ = vblendps_avx(auVar3,auVar7,0xc0);
  local_f8.coord.rot.m_data[0] = _ChLinkMotorRotationSpeed;
  local_f8.coord.rot.m_data[1] = _ChBody;
  local_f8.coord.rot.m_data[2] = _ComputeMassProperties;
  local_f8.coord.rot.m_data[3] = 0.93;
  local_f8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.23;
  local_f8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.238;
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  emplace_back<chrono::robosimian::BoxShape>(this_00,(BoxShape *)&local_f8);
  chrono::Q_from_AngZ(-0.38153);
  local_f8.coord.pos.m_data[0] = 0.075769;
  local_f8._vptr_ChFrame = (_func_int **)0x3fd040639d5e4a38;
  local_f8.coord.pos.m_data[1] = 0.0;
  local_f8.coord.pos.m_data[2] = local_198.m_data[0];
  local_f8.coord.rot.m_data[0] = local_198.m_data[1];
  local_f8.coord.rot.m_data[1] = local_198.m_data[2];
  local_f8.coord.rot.m_data[2] = local_198.m_data[3];
  local_f8.coord.rot.m_data[3] = 0.36257;
  local_f8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.23;
  local_f8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.238;
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  emplace_back<chrono::robosimian::BoxShape>(this_00,(BoxShape *)&local_f8);
  chrono::Q_from_AngZ(0.38153);
  local_f8.coord.pos.m_data[0] = 0.075769;
  local_f8._vptr_ChFrame = (_func_int **)0xbfd040639d5e4a38;
  local_f8.coord.pos.m_data[1] = 0.0;
  local_f8.coord.pos.m_data[2] = local_198.m_data[0];
  local_f8.coord.rot.m_data[0] = local_198.m_data[1];
  local_f8.coord.rot.m_data[1] = local_198.m_data[2];
  local_f8.coord.rot.m_data[2] = local_198.m_data[3];
  local_f8.coord.rot.m_data[3] = 0.36257;
  local_f8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.23;
  local_f8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.238;
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  emplace_back<chrono::robosimian::BoxShape>(this_00,(BoxShape *)&local_f8);
  chrono::Q_from_AngZ(0.38153);
  local_f8.coord.pos.m_data[0] = -0.075769;
  local_f8._vptr_ChFrame = (_func_int **)0x3fd040639d5e4a38;
  local_f8.coord.pos.m_data[1] = 0.0;
  local_f8.coord.pos.m_data[2] = local_198.m_data[0];
  local_f8.coord.rot.m_data[0] = local_198.m_data[1];
  local_f8.coord.rot.m_data[1] = local_198.m_data[2];
  local_f8.coord.rot.m_data[2] = local_198.m_data[3];
  local_f8.coord.rot.m_data[3] = 0.36257;
  local_f8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.23;
  local_f8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.238;
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  emplace_back<chrono::robosimian::BoxShape>(this_00,(BoxShape *)&local_f8);
  chrono::Q_from_AngZ(-0.38153);
  local_f8.coord.pos.m_data[0] = -0.075769;
  local_f8._vptr_ChFrame = (_func_int **)0xbfd040639d5e4a38;
  local_f8.coord.pos.m_data[1] = 0.0;
  local_f8.coord.pos.m_data[2] = local_198.m_data[0];
  local_f8.coord.rot.m_data[0] = local_198.m_data[1];
  local_f8.coord.rot.m_data[1] = local_198.m_data[2];
  local_f8.coord.rot.m_data[2] = local_198.m_data[3];
  local_f8.coord.rot.m_data[3] = 0.36257;
  local_f8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.23;
  local_f8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.238;
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  emplace_back<chrono::robosimian::BoxShape>(this_00,(BoxShape *)&local_f8);
  chrono::Q_from_AngZ(1.5707963267948966);
  chrono::Q_from_AngX(1.1868243267948966);
  ChQuaternion<double>::operator*(&local_198,&local_50,&local_70);
  this_01 = &(this->super_RS_Part).m_cylinders;
  local_f8._0_16_ = ZEXT816(0x3fdab0f27bb2fec5);
  local_f8.coord.pos.m_data[1] = -0.15864;
  local_f8.coord.pos.m_data[2] = local_198.m_data[0];
  local_f8.coord.rot.m_data[0] = local_198.m_data[1];
  local_f8.coord.rot.m_data[1] = local_198.m_data[2];
  local_f8.coord.rot.m_data[2] = local_198.m_data[3];
  local_f8.coord.rot.m_data[3] = 0.05;
  local_f8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.144;
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::emplace_back<chrono::robosimian::CylinderShape>(this_01,(CylinderShape *)&local_f8);
  chrono::Q_from_AngX(1.5707963267948966);
  local_f8.coord.pos.m_data[0] = 0.2094;
  local_f8._vptr_ChFrame = (_func_int **)0x3fd2c4c5974e65bf;
  local_f8.coord.pos.m_data[1] = 0.011499999999999996;
  local_f8.coord.pos.m_data[2] = local_198.m_data[0];
  local_f8.coord.rot.m_data[0] = local_198.m_data[1];
  local_f8.coord.rot.m_data[1] = local_198.m_data[2];
  local_f8.coord.rot.m_data[2] = local_198.m_data[3];
  local_f8.coord.rot.m_data[3] = 0.05;
  local_f8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.145;
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::emplace_back<chrono::robosimian::CylinderShape>(this_01,(CylinderShape *)&local_f8);
  chrono::Q_from_AngX(1.5707963267948966);
  local_f8.coord.pos.m_data[0] = 0.2094;
  local_f8._vptr_ChFrame = (_func_int **)0xbfd2c4c5974e65bf;
  local_f8.coord.pos.m_data[1] = 0.011499999999999996;
  local_f8.coord.pos.m_data[2] = local_198.m_data[0];
  local_f8.coord.rot.m_data[0] = local_198.m_data[1];
  local_f8.coord.rot.m_data[1] = local_198.m_data[2];
  local_f8.coord.rot.m_data[2] = local_198.m_data[3];
  local_f8.coord.rot.m_data[3] = 0.05;
  local_f8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.145;
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::emplace_back<chrono::robosimian::CylinderShape>(this_01,(CylinderShape *)&local_f8);
  chrono::Q_from_AngX(1.5707963267948966);
  local_f8.coord.pos.m_data[0] = -0.2094;
  local_f8._vptr_ChFrame = (_func_int **)0xbfd2c4c5974e65bf;
  local_f8.coord.pos.m_data[1] = 0.011499999999999996;
  local_f8.coord.pos.m_data[2] = local_198.m_data[0];
  local_f8.coord.rot.m_data[0] = local_198.m_data[1];
  local_f8.coord.rot.m_data[1] = local_198.m_data[2];
  local_f8.coord.rot.m_data[2] = local_198.m_data[3];
  local_f8.coord.rot.m_data[3] = 0.05;
  local_f8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.145;
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::emplace_back<chrono::robosimian::CylinderShape>(this_01,(CylinderShape *)&local_f8);
  chrono::Q_from_AngX(1.5707963267948966);
  local_f8.coord.pos.m_data[0] = -0.2094;
  local_f8._vptr_ChFrame = (_func_int **)0x3fd2c4c5974e65bf;
  local_f8.coord.pos.m_data[1] = 0.011499999999999996;
  local_f8.coord.pos.m_data[2] = local_198.m_data[0];
  local_f8.coord.rot.m_data[0] = local_198.m_data[1];
  local_f8.coord.rot.m_data[1] = local_198.m_data[2];
  local_f8.coord.rot.m_data[2] = local_198.m_data[3];
  local_f8.coord.rot.m_data[3] = 0.05;
  local_f8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.145;
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::emplace_back<chrono::robosimian::CylinderShape>(this_01,(CylinderShape *)&local_f8);
  std::__cxx11::string::assign((char *)&(this->super_RS_Part).m_mesh_name);
  auVar5._8_4_ = 0x3ecccccd;
  auVar5._0_8_ = 0x3ecccccd3ecccccd;
  auVar5._12_4_ = 0x3ecccccd;
  (this->super_RS_Part).m_offset.m_data[2] = 0.0;
  (this->super_RS_Part).m_offset.m_data[0] = 0.0;
  (this->super_RS_Part).m_offset.m_data[1] = 0.0;
  uVar1 = vmovlps_avx(auVar5);
  (this->super_RS_Part).m_color.R = (float)(int)uVar1;
  (this->super_RS_Part).m_color.G = (float)(int)((ulong)uVar1 >> 0x20);
  (this->super_RS_Part).m_color.B = 0.7;
  return;
}

Assistant:

RS_Chassis::RS_Chassis(const std::string& name, bool fixed, std::shared_ptr<ChMaterialSurface> mat, ChSystem* system)
    : RS_Part(name, mat, system), m_collide(false) {
    double mass = 46.658335;
    ChVector<> com(0.040288, -0.001937, -0.073574);
    ChVector<> inertia_xx(1.272134, 2.568776, 3.086984);
    ChVector<> inertia_xy(0.008890, -0.13942, 0.000325);

    m_body->SetIdentifier(0);
    m_body->SetMass(mass);
    m_body->SetFrame_COG_to_REF(ChFrame<>(com, ChQuaternion<>(1, 0, 0, 0)));
    m_body->SetInertiaXX(inertia_xx);
    m_body->SetInertiaXY(inertia_xy);
    m_body->SetBodyFixed(fixed);
    system->Add(m_body);

    // Create the set of primitive shapes
    m_boxes.push_back(BoxShape(VNULL, QUNIT, ChVector<>(0.257, 0.50, 0.238)));
    m_boxes.push_back(BoxShape(VNULL, QUNIT, ChVector<>(0.93, 0.230, 0.238)));
    m_boxes.push_back(
        BoxShape(ChVector<>(+0.25393, +0.075769, 0), Q_from_AngZ(-0.38153), ChVector<>(0.36257, 0.23, 0.238)));
    m_boxes.push_back(
        BoxShape(ChVector<>(-0.25393, +0.075769, 0), Q_from_AngZ(+0.38153), ChVector<>(0.36257, 0.23, 0.238)));
    m_boxes.push_back(
        BoxShape(ChVector<>(+0.25393, -0.075769, 0), Q_from_AngZ(+0.38153), ChVector<>(0.36257, 0.23, 0.238)));
    m_boxes.push_back(
        BoxShape(ChVector<>(-0.25393, -0.075769, 0), Q_from_AngZ(-0.38153), ChVector<>(0.36257, 0.23, 0.238)));

    m_cylinders.push_back(CylinderShape(ChVector<>(0.417050, 0, -0.158640),
                                        Q_from_AngZ(CH_C_PI_2) * Q_from_AngX(CH_C_PI_2 - 0.383972), 0.05, 0.144));

    // Geometry for link0 (all limbs); these links are fixed to the chassis
    m_cylinders.push_back(
        CylinderShape(ChVector<>(+0.29326, +0.20940, 0.03650 - 0.025), Q_from_AngX(CH_C_PI_2), 0.05, 0.145));
    m_cylinders.push_back(
        CylinderShape(ChVector<>(-0.29326, +0.20940, 0.03650 - 0.025), Q_from_AngX(CH_C_PI_2), 0.05, 0.145));
    m_cylinders.push_back(
        CylinderShape(ChVector<>(-0.29326, -0.20940, 0.03650 - 0.025), Q_from_AngX(CH_C_PI_2), 0.05, 0.145));
    m_cylinders.push_back(
        CylinderShape(ChVector<>(+0.29326, -0.20940, 0.03650 - 0.025), Q_from_AngX(CH_C_PI_2), 0.05, 0.145));

    // Set the name of the visualization mesh
    m_mesh_name = "robosim_chassis";
    m_offset = ChVector<>(0, 0, 0);
    m_color = ChColor(0.4f, 0.4f, 0.7f);
}